

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::registerTopLevelItem(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  ensureSequentialTopLevelSiblingIndexes(this);
  this->field_0xb8 = this->field_0xb8 | 0x20;
  ((item->d_ptr).d)->siblingIndex = (int)(this->topLevelItems).d.size;
  QList<QGraphicsItem_*>::append(&this->topLevelItems,item);
  return;
}

Assistant:

void QGraphicsScenePrivate::registerTopLevelItem(QGraphicsItem *item)
{
    ensureSequentialTopLevelSiblingIndexes();
    needSortTopLevelItems = true; // ### maybe false
    item->d_ptr->siblingIndex = topLevelItems.size();
    topLevelItems.append(item);
}